

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O1

void __thiscall DSBarInfo::~DSBarInfo(DSBarInfo *this)

{
  (this->super_DBaseStatusBar).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_0070c428;
  FImageCollection::Uninit(&this->Images);
  TArray<FTextureID,_FTextureID>::~TArray(&(this->Images).ImageMap);
  (this->super_DBaseStatusBar).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_0070d0a8;
  TArray<FTextureID,_FTextureID>::~TArray(&(this->super_DBaseStatusBar).Images.ImageMap);
  DObject::~DObject((DObject *)this);
  return;
}

Assistant:

~DSBarInfo ()
	{
		Images.Uninit();
	}